

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

void anon_unknown.dwarf_61d64::write_file<Imath_3_2::half>
               (char *filename,data<Imath_3_2::half> *main,int number_of_parts)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  ostream *poVar5;
  void *this;
  reference pvVar6;
  undefined4 *puVar7;
  reference pvVar8;
  reference this_00;
  Header *hdr;
  size_type sVar9;
  int in_EDX;
  char *in_RDI;
  DeepScanLineOutputPart p;
  int i_2;
  MultiPartOutputFile f;
  int i_1;
  vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
  sub_parts;
  ostringstream s;
  int i;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> headers;
  undefined8 in_stack_fffffffffffffc60;
  int range;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *this_01;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  size_type in_stack_fffffffffffffc78;
  vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
  *in_stack_fffffffffffffc80;
  allocator<char> *in_stack_fffffffffffffc90;
  data<Imath_3_2::half> *this_02;
  char *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  data<Imath_3_2::half> *this_03;
  DeepScanLineOutputPart local_248 [12];
  int local_23c;
  MultiPartOutputFile local_238 [16];
  int local_228;
  undefined1 local_221 [57];
  ostringstream local_1e8 [320];
  DeepScanLineOutputPart *in_stack_ffffffffffffff58;
  data<Imath_3_2::half> *in_stack_ffffffffffffff60;
  int local_70;
  undefined1 local_69 [57];
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> local_30;
  int local_14;
  char *local_8;
  
  range = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  local_14 = in_EDX;
  local_8 = in_RDI;
  std::allocator<Imf_3_4::Header>::allocator((allocator<Imf_3_4::Header> *)0x14e8a3);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)in_stack_fffffffffffffc80,
             in_stack_fffffffffffffc78,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  std::allocator<Imf_3_4::Header>::~allocator((allocator<Imf_3_4::Header> *)0x14e8cf);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  lVar3 = Imf_3_4::Header::displayWindow();
  *(undefined4 *)(lVar3 + 8) = 0xa4;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  lVar3 = Imf_3_4::Header::displayWindow();
  *(undefined4 *)(lVar3 + 0xc) = 0xd8;
  iVar1 = random_int(range);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  piVar4 = (int *)Imf_3_4::Header::dataWindow();
  *piVar4 = iVar1 + -200;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  piVar4 = (int *)Imf_3_4::Header::dataWindow();
  iVar1 = *piVar4;
  iVar2 = random_int(range);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  lVar3 = Imf_3_4::Header::dataWindow();
  *(int *)(lVar3 + 8) = iVar1 + 0x28 + iVar2;
  iVar1 = random_int(range);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  lVar3 = Imf_3_4::Header::dataWindow();
  *(int *)(lVar3 + 4) = iVar1 + -200;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  lVar3 = Imf_3_4::Header::dataWindow();
  iVar1 = *(int *)(lVar3 + 4);
  iVar2 = random_int(range);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  lVar3 = Imf_3_4::Header::dataWindow();
  *(int *)(lVar3 + 0xc) = iVar1 + 0x28 + iVar2;
  poVar5 = std::operator<<((ostream *)&std::cout,"data window: ");
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  piVar4 = (int *)Imf_3_4::Header::dataWindow();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*piVar4);
  poVar5 = std::operator<<(poVar5,',');
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  lVar3 = Imf_3_4::Header::dataWindow();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)(lVar3 + 4));
  poVar5 = std::operator<<(poVar5,' ');
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  lVar3 = Imf_3_4::Header::dataWindow();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)(lVar3 + 8));
  poVar5 = std::operator<<(poVar5,',');
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  lVar3 = Imf_3_4::Header::dataWindow();
  this = (void *)std::ostream::operator<<(poVar5,*(int *)(lVar3 + 0xc));
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  pvVar6 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  Imf_3_4::Header::setType((string *)pvVar6);
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  puVar7 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar7 = 2;
  pvVar6 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
  this_03 = (data<Imath_3_2::half> *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  Imf_3_4::Header::setName((string *)pvVar6);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  for (local_70 = 1; local_70 < local_14; local_70 = local_70 + 1) {
    pvVar8 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0)
    ;
    this_00 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                        (&local_30,(long)local_70);
    Imf_3_4::Header::operator=(this_00,pvVar8);
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    poVar5 = std::operator<<((ostream *)local_1e8,"Part");
    std::ostream::operator<<(poVar5,local_70);
    pvVar8 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                       (&local_30,(long)local_70);
    std::__cxx11::ostringstream::str();
    Imf_3_4::Header::setName((string *)pvVar8);
    std::__cxx11::string::~string((string *)(local_221 + 0x19));
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
  }
  hdr = (Header *)(long)local_14;
  this_02 = (data<Imath_3_2::half> *)local_221;
  std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>::allocator
            ((allocator<(anonymous_namespace)::data<Imath_3_2::half>_> *)0x14ef64);
  std::
  vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
  ::vector(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>::~allocator
            ((allocator<(anonymous_namespace)::data<Imath_3_2::half>_> *)0x14ef8a);
  if (1 < local_14) {
    data<Imath_3_2::half>::frak
              (this_03,(vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
                        *)pvVar6);
  }
  if (local_14 == 1) {
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](&local_30,0);
    data<Imath_3_2::half>::setHeader(this_02,hdr);
  }
  else {
    for (local_228 = 0; local_228 < local_14; local_228 = local_228 + 1) {
      std::
      vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
      ::operator[]((vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
                    *)(local_221 + 1),(long)local_228);
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[]
                (&local_30,(long)local_228);
      data<Imath_3_2::half>::setHeader(this_02,hdr);
    }
  }
  this_01 = &local_30;
  pvVar6 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::operator[](this_01,0);
  sVar9 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size(this_01);
  iVar1 = (int)sVar9;
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile(local_238,local_8,pvVar6,iVar1,false,iVar2);
  for (local_23c = 0; local_23c < local_14; local_23c = local_23c + 1) {
    Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart(local_248,local_238,local_23c);
    if (local_14 == 1) {
      data<Imath_3_2::half>::writeData(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    else {
      std::
      vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
      ::operator[]((vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
                    *)(local_221 + 1),(long)local_23c);
      data<Imath_3_2::half>::writeData(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(local_238);
  std::
  vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
  ::~vector((vector<(anonymous_namespace)::data<Imath_3_2::half>,_std::allocator<(anonymous_namespace)::data<Imath_3_2::half>_>_>
             *)CONCAT44(iVar2,iVar1));
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)CONCAT44(iVar2,iVar1));
  return;
}

Assistant:

void
write_file (const char* filename, const data<T>& main, int number_of_parts)
{
    vector<Header> headers (number_of_parts);

    // all headers are the same in this test
    headers[0].displayWindow ().max.x = 164;
    headers[0].displayWindow ().max.y = 216;
    headers[0].dataWindow ().min.x    = random_int (400) - 200;
    headers[0].dataWindow ().max.x =
        headers[0].dataWindow ().min.x + 40 + random_int (400);
    headers[0].dataWindow ().min.y = random_int (400) - 200;
    headers[0].dataWindow ().max.y =
        headers[0].dataWindow ().min.y + 40 + random_int (400);
    cout << "data window: " << headers[0].dataWindow ().min.x << ','
         << headers[0].dataWindow ().min.y << ' '
         << headers[0].dataWindow ().max.x << ','
         << headers[0].dataWindow ().max.y << endl;
    headers[0].setType (DEEPSCANLINE);
    headers[0].compression () = ZIPS_COMPRESSION;
    headers[0].setName ("Part0");

    for (int i = 1; i < number_of_parts; i++)
    {
        headers[i] = headers[0];
        ostringstream s;
        s << "Part" << i;
        headers[i].setName (s.str ());
    }

    vector<data<T>> sub_parts (number_of_parts);

    if (number_of_parts > 1) { main.frak (sub_parts); }

    if (number_of_parts == 1) { main.setHeader (headers[0]); }
    else
    {

        for (int i = 0; i < number_of_parts; i++)
        {
            sub_parts[i].setHeader (headers[i]);
        }
    }

    MultiPartOutputFile f (filename, &headers[0], headers.size ());
    for (int i = 0; i < number_of_parts; i++)
    {
        DeepScanLineOutputPart p (f, i);
        if (number_of_parts == 1) { main.writeData (p); }
        else { sub_parts[i].writeData (p); }
    }
}